

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

CURLcode Curl_dynhds_h1_add_line(dynhds *dynhds,char *line,size_t line_len)

{
  char *value_00;
  dynhds_entry *pdVar1;
  dynhds_entry *pdVar2;
  char *pcVar3;
  bool bVar4;
  dynhds_entry *e2;
  dynhds_entry *e;
  size_t i;
  size_t valuelen;
  char *value;
  size_t namelen;
  char *name;
  char *p;
  size_t line_len_local;
  char *line_local;
  dynhds *dynhds_local;
  
  if ((line == (char *)0x0) || (line_len == 0)) {
    dynhds_local._4_4_ = CURLE_OK;
  }
  else if ((*line == ' ') || (*line == '\t')) {
    p = (char *)line_len;
    line_len_local = (size_t)line;
    if (dynhds->hds_len == 0) {
      dynhds_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
    else {
      while( true ) {
        bVar4 = false;
        if ((p != (char *)0x0) && (bVar4 = true, *(char *)line_len_local != ' ')) {
          bVar4 = *(char *)line_len_local == '\t';
        }
        if (!bVar4) break;
        line_len_local = line_len_local + 1;
        p = p + -1;
      }
      if (p == (char *)0x0) {
        dynhds_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
      }
      else {
        pdVar2 = dynhds->hds[dynhds->hds_len - 1];
        pdVar1 = entry_append(pdVar2,(char *)line_len_local,(size_t)p);
        if (pdVar1 == (dynhds_entry *)0x0) {
          dynhds_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          dynhds->hds[dynhds->hds_len - 1] = pdVar1;
          entry_free(pdVar2);
          dynhds_local._4_4_ = CURLE_OK;
        }
      }
    }
  }
  else {
    name = (char *)memchr(line,0x3a,line_len);
    if (name == (char *)0x0) {
      dynhds_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
    else {
      pdVar2 = (dynhds_entry *)(name + -(long)line);
      e = pdVar2;
      do {
        name = name + 1;
        value_00 = name;
        e = (dynhds_entry *)((long)&e->name + 1);
        if (line_len <= e) break;
      } while ((*name == ' ') || (*name == '\t'));
      i = line_len - (long)e;
      pcVar3 = (char *)memchr(name,0xd,i);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)memchr(name,10,i);
      }
      name = pcVar3;
      if (name != (char *)0x0) {
        i = (long)name - (long)value_00;
      }
      dynhds_local._4_4_ = Curl_dynhds_add(dynhds,line,(size_t)pdVar2,value_00,i);
    }
  }
  return dynhds_local._4_4_;
}

Assistant:

CURLcode Curl_dynhds_h1_add_line(struct dynhds *dynhds,
                                 const char *line, size_t line_len)
{
  const char *p;
  const char *name;
  size_t namelen;
  const char *value;
  size_t valuelen, i;

  if(!line || !line_len)
    return CURLE_OK;

  if((line[0] == ' ') || (line[0] == '\t')) {
    struct dynhds_entry *e, *e2;
    /* header continuation, yikes! */
    if(!dynhds->hds_len)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    while(line_len && ISBLANK(line[0])) {
      ++line;
      --line_len;
    }
    if(!line_len)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    e = dynhds->hds[dynhds->hds_len-1];
    e2 = entry_append(e, line, line_len);
    if(!e2)
      return CURLE_OUT_OF_MEMORY;
    dynhds->hds[dynhds->hds_len-1] = e2;
    entry_free(e);
    return CURLE_OK;
  }
  else {
    p = memchr(line, ':', line_len);
    if(!p)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    name = line;
    namelen = p - line;
    p++; /* move past the colon */
    for(i = namelen + 1; i < line_len; ++i, ++p) {
      if(!ISBLANK(*p))
        break;
    }
    value = p;
    valuelen = line_len - i;

    p = memchr(value, '\r', valuelen);
    if(!p)
      p = memchr(value, '\n', valuelen);
    if(p)
      valuelen = (size_t)(p - value);

    return Curl_dynhds_add(dynhds, name, namelen, value, valuelen);
  }
}